

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstree.cpp
# Opt level: O0

BSTNode * __thiscall search::BSTNode::forerunner(BSTNode *this)

{
  bool bVar1;
  BSTNode *local_28;
  BSTNode *p;
  BSTNode *node;
  BSTNode *this_local;
  
  if (this->left_ == (BSTNode *)0x0) {
    local_28 = this->parent_;
    p = this;
    while( true ) {
      bVar1 = false;
      if (local_28 != (BSTNode *)0x0) {
        bVar1 = local_28->left_ == p;
      }
      if (!bVar1) break;
      p = local_28;
      local_28 = local_28->parent_;
    }
    this_local = local_28;
  }
  else {
    this_local = max(this->left_);
  }
  return this_local;
}

Assistant:

BSTNode* BSTNode::forerunner()
    {
        if (left_)
            return left_->max();
        else
        {
            BSTNode* node = this;
            BSTNode* p = parent_;
            while (p && p->left_ == node)
            {
                // this is min of node
                node = p;
                p = node->parent_;
            }
            return p;
        }
    }